

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-parser-test-suite.c
# Opt level: O0

void print_escaped(yaml_char_t *str,size_t length)

{
  yaml_char_t yVar1;
  int local_1c;
  char c;
  int i;
  size_t length_local;
  yaml_char_t *str_local;
  
  for (local_1c = 0; (ulong)(long)local_1c < length; local_1c = local_1c + 1) {
    yVar1 = str[local_1c];
    if (yVar1 == '\\') {
      printf("\\\\");
    }
    else if (yVar1 == '\0') {
      printf("\\0");
    }
    else if (yVar1 == '\b') {
      printf("\\b");
    }
    else if (yVar1 == '\n') {
      printf("\\n");
    }
    else if (yVar1 == '\r') {
      printf("\\r");
    }
    else if (yVar1 == '\t') {
      printf("\\t");
    }
    else {
      printf("%c",(ulong)(uint)(int)(char)yVar1);
    }
  }
  return;
}

Assistant:

void print_escaped(yaml_char_t * str, size_t length)
{
    int i;
    char c;

    for (i = 0; i < length; i++) {
        c = *(str + i);
        if (c == '\\')
            printf("\\\\");
        else if (c == '\0')
            printf("\\0");
        else if (c == '\b')
            printf("\\b");
        else if (c == '\n')
            printf("\\n");
        else if (c == '\r')
            printf("\\r");
        else if (c == '\t')
            printf("\\t");
        else
            printf("%c", c);
    }
}